

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

double duckdb::DatePart::JulianDayOperator::Operation<duckdb::interval_t,double>(interval_t input)

{
  NotImplementedException *this;
  allocator local_39;
  string local_38;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10,input.micros);
  ::std::__cxx11::string::string
            ((string *)&local_38,"interval units \"julian\" not recognized",&local_39);
  NotImplementedException::NotImplementedException(this,&local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

double DatePart::JulianDayOperator::Operation(interval_t input) {
	throw NotImplementedException("interval units \"julian\" not recognized");
}